

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Impl::applyStructSizeRequirement
          (Impl *this,RawSchema *raw,uint dataWordCount,uint pointerCount)

{
  Reader node_00;
  uint16_t uVar1;
  word *pwVar2;
  size_t sVar3;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  ArrayPtr<capnp::word> words;
  Reader structNode;
  Reader node;
  uint pointerCount_local;
  uint dataWordCount_local;
  RawSchema *raw_local;
  Impl *this_local;
  
  readMessageUnchecked<capnp::schema::Node>
            ((Reader *)&structNode._reader.nestingLimit,raw->encodedNode);
  capnp::schema::Node::Reader::getStruct
            ((Reader *)&words.size_,(Reader *)&structNode._reader.nestingLimit);
  uVar1 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)&words.size_);
  if ((dataWordCount <= uVar1) &&
     (uVar1 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)&words.size_),
     pointerCount <= uVar1)) {
    return;
  }
  memcpy(&local_c0,&structNode._reader.nestingLimit,0x30);
  node_00._reader.capTable = (CapTableReader *)uStack_b8;
  node_00._reader.segment = (SegmentReader *)local_c0;
  node_00._reader.data = (void *)local_b0;
  node_00._reader.pointers = (WirePointer *)uStack_a8;
  node_00._reader.dataSize = (undefined4)local_a0;
  node_00._reader.pointerCount = local_a0._4_2_;
  node_00._reader._38_2_ = local_a0._6_2_;
  node_00._reader._40_8_ = uStack_98;
  _local_90 = rewriteStructNodeWithSizes(this,node_00,dataWordCount,pointerCount);
  pwVar2 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)local_90);
  raw->encodedNode = pwVar2;
  sVar3 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)local_90);
  raw->encodedSize = (uint32_t)sVar3;
  return;
}

Assistant:

void SchemaLoader::Impl::applyStructSizeRequirement(
    _::RawSchema* raw, uint dataWordCount, uint pointerCount) {
  auto node = readMessageUnchecked<schema::Node>(raw->encodedNode);

  auto structNode = node.getStruct();
  if (structNode.getDataWordCount() < dataWordCount ||
      structNode.getPointerCount() < pointerCount) {
    // Sizes need to be increased.  Must rewrite.
    kj::ArrayPtr<word> words = rewriteStructNodeWithSizes(node, dataWordCount, pointerCount);

    // We don't need to re-validate the node because we know this change could not possibly have
    // invalidated it.  Just remake the unchecked message.
    raw->encodedNode = words.begin();
    raw->encodedSize = words.size();
  }
}